

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool print_number(cJSON *item,printbuffer *output_buffer)

{
  double b;
  int iVar1;
  int iVar2;
  cJSON_bool cVar3;
  uchar *puVar4;
  double local_78;
  double test;
  uchar local_68 [7];
  uchar decimal_point;
  uchar number_buffer [26];
  ulong local_40;
  size_t i;
  int length;
  double d;
  uchar *output_pointer;
  printbuffer *output_buffer_local;
  cJSON *item_local;
  
  b = item->valuedouble;
  memset(local_68,0,0x1a);
  test._7_1_ = get_decimal_point();
  local_78 = 0.0;
  if (output_buffer == (printbuffer *)0x0) {
    return 0;
  }
  if (!NAN(b)) {
    iVar2 = 1;
    if ((long)b < 0) {
      iVar2 = -1;
    }
    iVar1 = 0;
    if (ABS(b) == INFINITY) {
      iVar1 = iVar2;
    }
    if (iVar1 == 0) {
      if ((b != (double)item->valueint) || (NAN(b) || NAN((double)item->valueint))) {
        i._4_4_ = sprintf((char *)local_68,"%1.15g",b);
        iVar2 = __isoc99_sscanf(local_68,"%lg",&local_78);
        if ((iVar2 != 1) || (cVar3 = compare_double(local_78,b), cVar3 == 0)) {
          i._4_4_ = sprintf((char *)local_68,"%1.17g",b);
        }
      }
      else {
        i._4_4_ = sprintf((char *)local_68,"%d",(ulong)(uint)item->valueint);
      }
      goto LAB_001074b6;
    }
  }
  i._4_4_ = sprintf((char *)local_68,"null");
LAB_001074b6:
  if ((i._4_4_ < 0) || (0x19 < i._4_4_)) {
    item_local._4_4_ = 0;
  }
  else {
    puVar4 = ensure(output_buffer,(long)i._4_4_ + 1);
    if (puVar4 == (uchar *)0x0) {
      item_local._4_4_ = 0;
    }
    else {
      for (local_40 = 0; local_40 < (ulong)(long)i._4_4_; local_40 = local_40 + 1) {
        if (local_68[local_40] == test._7_1_) {
          puVar4[local_40] = '.';
        }
        else {
          puVar4[local_40] = local_68[local_40];
        }
      }
      puVar4[local_40] = '\0';
      output_buffer->offset = (long)i._4_4_ + output_buffer->offset;
      item_local._4_4_ = 1;
    }
  }
  return item_local._4_4_;
}

Assistant:

static cJSON_bool print_number(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output_pointer = NULL;
    double d = item->valuedouble;
    int length = 0;
    size_t i = 0;
    unsigned char number_buffer[26] = {0}; /* temporary buffer to print the number into */
    unsigned char decimal_point = get_decimal_point();
    double test = 0.0;

    if (output_buffer == NULL)
    {
        return false;
    }

    /* This checks for NaN and Infinity */
    if (isnan(d) || isinf(d))
    {
        length = sprintf((char*)number_buffer, "null");
    }
	else if(d == (double)item->valueint)
	{
		length = sprintf((char*)number_buffer, "%d", item->valueint);
	}
    else
    {
        /* Try 15 decimal places of precision to avoid nonsignificant nonzero digits */
        length = sprintf((char*)number_buffer, "%1.15g", d);

        /* Check whether the original double can be recovered */
        if ((sscanf((char*)number_buffer, "%lg", &test) != 1) || !compare_double((double)test, d))
        {
            /* If not, print with 17 decimal places of precision */
            length = sprintf((char*)number_buffer, "%1.17g", d);
        }
    }

    /* sprintf failed or buffer overrun occurred */
    if ((length < 0) || (length > (int)(sizeof(number_buffer) - 1)))
    {
        return false;
    }

    /* reserve appropriate space in the output */
    output_pointer = ensure(output_buffer, (size_t)length + sizeof(""));
    if (output_pointer == NULL)
    {
        return false;
    }

    /* copy the printed number to the output and replace locale
     * dependent decimal point with '.' */
    for (i = 0; i < ((size_t)length); i++)
    {
        if (number_buffer[i] == decimal_point)
        {
            output_pointer[i] = '.';
            continue;
        }

        output_pointer[i] = number_buffer[i];
    }
    output_pointer[i] = '\0';

    output_buffer->offset += (size_t)length;

    return true;
}